

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::BoxCoordinatesMode::ByteSizeLong(BoxCoordinatesMode *this)

{
  BoxCoordinatesMode_Coordinates BVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  BoxCoordinatesMode *this_local;
  
  sStack_18 = 0;
  BVar1 = boxmode(this);
  if (BVar1 != BoxCoordinatesMode_Coordinates_CORNERS_HEIGHT_FIRST) {
    BVar1 = boxmode(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(BVar1);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t BoxCoordinatesMode::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BoxCoordinatesMode)
  size_t total_size = 0;

  // .CoreML.Specification.BoxCoordinatesMode.Coordinates boxMode = 1;
  if (this->boxmode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->boxmode());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}